

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.h
# Opt level: O3

mat<4UL,_4UL> * __thiscall
mat<4UL,_4UL>::invert_transpose(mat<4UL,_4UL> *__return_storage_ptr__,mat<4UL,_4UL> *this)

{
  undefined1 auVar1 [16];
  long lVar2;
  bool bVar3;
  double ret_1;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  mat<4UL,_4UL> ret;
  mat<4UL,_4UL> local_90;
  
  adjugate(&local_90,this);
  dVar4 = 0.0;
  lVar2 = 3;
  do {
    dVar4 = dVar4 + local_90.rows[0].data[lVar2] * this->rows[0].data[lVar2];
    bVar3 = lVar2 != 0;
    lVar2 = lVar2 + -1;
  } while (bVar3);
  __return_storage_ptr__->rows[3].data[2] = 0.0;
  __return_storage_ptr__->rows[3].data[3] = 0.0;
  __return_storage_ptr__->rows[3].data[0] = 0.0;
  __return_storage_ptr__->rows[3].data[1] = 0.0;
  __return_storage_ptr__->rows[2].data[2] = 0.0;
  __return_storage_ptr__->rows[2].data[3] = 0.0;
  __return_storage_ptr__->rows[2].data[0] = 0.0;
  __return_storage_ptr__->rows[2].data[1] = 0.0;
  __return_storage_ptr__->rows[1].data[2] = 0.0;
  __return_storage_ptr__->rows[1].data[3] = 0.0;
  __return_storage_ptr__->rows[1].data[0] = 0.0;
  __return_storage_ptr__->rows[1].data[1] = 0.0;
  __return_storage_ptr__->rows[0].data[2] = 0.0;
  __return_storage_ptr__->rows[0].data[3] = 0.0;
  __return_storage_ptr__->rows[0].data[0] = 0.0;
  __return_storage_ptr__->rows[0].data[1] = 0.0;
  lVar2 = 0x60;
  do {
    auVar5._8_8_ = dVar4;
    auVar5._0_8_ = dVar4;
    auVar6 = divpd(*(undefined1 (*) [16])((long)local_90.rows[0].data + lVar2 + 0x10),auVar5);
    auVar1._8_8_ = dVar4;
    auVar1._0_8_ = dVar4;
    auVar5 = divpd(*(undefined1 (*) [16])((long)local_90.rows[0].data + lVar2),auVar1);
    *(undefined1 (*) [16])((long)__return_storage_ptr__->rows[0].data + lVar2) = auVar5;
    *(undefined1 (*) [16])((long)__return_storage_ptr__->rows[0].data + lVar2 + 0x10) = auVar6;
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x20);
  return __return_storage_ptr__;
}

Assistant:

mat<nrows, ncols> invert_transpose() const
    {
        mat<nrows, ncols> ret = adjugate();
        return ret / dot(ret[0], rows[0]);
    }